

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.hh
# Opt level: O1

void __thiscall
kratos::PortBundleRef::PortBundleRef
          (PortBundleRef *this,Generator *generator,PortBundleDefinition *def)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  
  (this->super_PackedInterface)._vptr_PackedInterface =
       (_func_int **)&PTR_member_names_abi_cxx11__004ce328;
  this->generator = generator;
  paVar1 = &(this->definition_).name_.field_2;
  (this->definition_).name_._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (def->name_)._M_dataplus._M_p;
  paVar2 = &(def->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&(def->name_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->definition_).name_.field_2 + 8) = uVar5;
  }
  else {
    (this->definition_).name_._M_dataplus._M_p = pcVar4;
    (this->definition_).name_.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->definition_).name_._M_string_length = (def->name_)._M_string_length;
  (def->name_)._M_dataplus._M_p = (pointer)paVar2;
  (def->name_)._M_string_length = 0;
  (def->name_).field_2._M_local_buf[0] = '\0';
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->definition_).definitions_._M_t._M_impl.super__Rb_tree_header,
             &(def->definitions_)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->definition_).flipped_definitions_._M_t._M_impl.super__Rb_tree_header,
             &(def->flipped_definitions_)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->definition_).debug_info_._M_t._M_impl.super__Rb_tree_header,
             &(def->debug_info_)._M_t._M_impl.super__Rb_tree_header);
  p_Var3 = &(this->name_mappings_)._M_t._M_impl.super__Rb_tree_header;
  (this->name_mappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->name_mappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->name_mappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->name_mappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->name_mappings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

PortBundleRef(Generator *generator, PortBundleDefinition def)
        : generator(generator), definition_(std::move(def)) {}